

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

fct_test_t * fct_test_new(char *name)

{
  int iVar1;
  fct_test_t *local_28;
  fct_test_t *test;
  int ok;
  char *name_local;
  
  local_28 = (fct_test_t *)malloc(0x148);
  if (local_28 == (fct_test_t *)0x0) {
    name_local = (char *)0x0;
  }
  else {
    fctstr_safe_cpy(local_28->name,name,0x100);
    fct_nlist__init2((fct_nlist_t *)local_28,0);
    iVar1 = fct_nlist__init2(&local_28->passed_chks,8);
    if (iVar1 == 0) {
      fct_test__del(local_28);
      local_28 = (fct_test_t *)0x0;
    }
    else {
      fct_timer__init(&local_28->timer);
    }
    name_local = (char *)local_28;
  }
  return (fct_test_t *)name_local;
}

Assistant:

static fct_test_t*
fct_test_new(char const *name)
{
    nbool_t ok =FCT_FALSE;
    fct_test_t *test =NULL;

    test = (fct_test_t*)malloc(sizeof(fct_test_t));
    if ( test == NULL )
    {
        return NULL;
    }

    fctstr_safe_cpy(test->name, name, FCT_MAX_NAME);

    /* Failures are an exception, so lets not allocate up
    the list until we need to. */
    fct_nlist__init2(&(test->failed_chks), 0);
    if (!fct_nlist__init(&(test->passed_chks)))
    {
        ok =FCT_FALSE;
        goto finally;
    }

    fct_timer__init(&(test->timer));

    ok =FCT_TRUE;
finally:
    if ( !ok )
    {
        fct_test__del(test);
        test =NULL;
    }
    return test;
}